

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  int *piVar1;
  u8 uVar2;
  Mem *p;
  Btree *pBVar3;
  bool bVar4;
  sqlite3 *db_00;
  Vdbe *pVVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  ulong __n;
  size_t __n_00;
  long lVar11;
  int cookie;
  Parse sParse;
  u32 local_1cc;
  Parse local_1c8;
  
  memset(&local_1c8.zErrMsg,0,0xd0);
  memset(&local_1c8.sLastToken,0,0x88);
  local_1c8.pOuterParse = db->pParse;
  db->pParse = &local_1c8;
  local_1c8.db = db;
  local_1c8.pReprepare = pReprepare;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg(&local_1c8,"out of memory");
  }
  if ((prepFlags & 1) != 0) {
    local_1c8.disableLookaside = local_1c8.disableLookaside + '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    (db->lookaside).sz = 0;
  }
  bVar6 = (byte)prepFlags;
  local_1c8.disableVtab = bVar6 >> 2 & 1;
  iVar7 = 0;
  if ((db->noSharedCache == '\0') && (0 < db->nDb)) {
    lVar11 = 0;
    lVar10 = 0;
    iVar7 = 0;
    do {
      pBVar3 = *(Btree **)((long)&db->aDb->pBt + lVar11);
      iVar8 = 0;
      if (pBVar3 != (Btree *)0x0) {
        if ((pBVar3->sharable != '\0') &&
           (pBVar3->wantToLock = pBVar3->wantToLock + 1, pBVar3->locked == '\0')) {
          btreeLockCarefully(pBVar3);
        }
        iVar7 = querySharedCacheTableLock(pBVar3,1,'\x01');
        if (pBVar3->sharable != '\0') {
          piVar1 = &pBVar3->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(pBVar3);
          }
        }
        if (iVar7 == 0) {
          iVar8 = 0;
          iVar7 = 0;
        }
        else {
          sqlite3ErrorWithMsg(db,iVar7,"database schema is locked: %s",
                              *(undefined8 *)((long)&db->aDb->zDbSName + lVar11));
          iVar8 = 5;
        }
      }
      if (iVar8 != 0) goto joined_r0x0014cdfe;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar10 < db->nDb);
  }
  sqlite3VtabUnlockList(db);
  if ((nBytes < 0) || ((__n = (ulong)(uint)nBytes, nBytes != 0 && (zSql[__n - 1] == '\0')))) {
    sqlite3RunParser(&local_1c8,zSql);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      iVar7 = apiHandleError(db,0x12);
      iVar8 = 5;
    }
    else {
      if (zSql == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = (char *)sqlite3DbMallocRawNN(db,__n + 1);
      }
      if (pcVar9 == (char *)0x0) {
        local_1c8.zTail = zSql + __n;
      }
      else {
        memcpy(pcVar9,zSql,__n);
        pcVar9[__n] = '\0';
        sqlite3RunParser(&local_1c8,pcVar9);
        local_1c8.zTail = zSql + ((long)local_1c8.zTail - (long)pcVar9);
        sqlite3DbFreeNN(db,pcVar9);
      }
      iVar8 = 0;
    }
    if (iVar8 != 0) {
joined_r0x0014cdfe:
      if (iVar8 != 5) {
        return iVar7;
      }
      goto LAB_0014d0f5;
    }
  }
  pVVar5 = local_1c8.pVdbe;
  if (pzTail != (char **)0x0) {
    *pzTail = local_1c8.zTail;
  }
  if (((db->init).busy == '\0') && (local_1c8.pVdbe != (Vdbe *)0x0)) {
    (local_1c8.pVdbe)->prepFlags = bVar6;
    if (-1 < (char)bVar6) {
      (local_1c8.pVdbe)->expmask = 0;
    }
    __n_00 = (size_t)((int)local_1c8.zTail - (int)zSql);
    if (zSql == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (char *)sqlite3DbMallocRawNN((local_1c8.pVdbe)->db,__n_00 + 1);
    }
    if (pcVar9 != (char *)0x0) {
      memcpy(pcVar9,zSql,__n_00);
      pcVar9[__n_00] = '\0';
    }
    pVVar5->zSql = pcVar9;
  }
  db_00 = local_1c8.db;
  if (db->mallocFailed != '\0') {
    local_1c8.rc = 7;
    local_1c8.checkSchema = '\0';
  }
  if ((local_1c8.rc == 0) || (local_1c8.rc == 0x65)) {
    *ppStmt = (sqlite3_stmt *)local_1c8.pVdbe;
    db->errCode = 0;
    db->errByteOffset = -1;
    p = db->pErr;
    iVar7 = 0;
    if (p != (Mem *)0x0) {
      if ((p->flags & 0x9000) == 0) {
        p->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(p);
      }
    }
  }
  else {
    if (((local_1c8.checkSchema != '\0') && ((db->init).busy == '\0')) && (0 < (local_1c8.db)->nDb))
    {
      lVar11 = 0;
      lVar10 = 0;
      do {
        pBVar3 = *(Btree **)((long)&db_00->aDb->pBt + lVar11);
        if (pBVar3 == (Btree *)0x0) {
          bVar4 = false;
        }
        else {
          uVar2 = pBVar3->inTrans;
          if ((uVar2 == '\0') && (iVar7 = sqlite3BtreeBeginTrans(pBVar3,0,(int *)0x0), iVar7 != 0))
          {
            bVar4 = true;
            if ((iVar7 == 0xc0a) || (iVar7 == 7)) {
              sqlite3OomFault(db_00);
              local_1c8.rc = 7;
              if (iVar7 == 0) goto LAB_0014d015;
            }
          }
          else {
LAB_0014d015:
            sqlite3BtreeGetMeta(pBVar3,1,&local_1cc);
            if (local_1cc != **(u32 **)((long)&db_00->aDb->pSchema + lVar11)) {
              sqlite3ResetOneSchema(db_00,(int)lVar10);
              local_1c8.rc = 0x11;
            }
            bVar4 = false;
            if (uVar2 == '\0') {
              sqlite3BtreeCommit(pBVar3);
            }
          }
        }
        if (bVar4) break;
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar10 < db_00->nDb);
    }
    if (local_1c8.pVdbe != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_1c8.pVdbe);
    }
    iVar7 = local_1c8.rc;
    if ((TriggerPrg *)local_1c8.zErrMsg == (TriggerPrg *)0x0) {
      db->errCode = local_1c8.rc;
      if ((local_1c8.rc == 0) && (db->pErr == (sqlite3_value *)0x0)) {
        db->errByteOffset = -1;
      }
      else {
        sqlite3ErrorFinish(db,local_1c8.rc);
      }
    }
    else {
      sqlite3ErrorWithMsg(db,local_1c8.rc,"%s");
      if ((TriggerPrg *)local_1c8.zErrMsg != (TriggerPrg *)0x0) goto LAB_0014d0e0;
    }
  }
  while (local_1c8.pTriggerPrg != (TriggerPrg *)0x0) {
    local_1c8.zErrMsg = (char *)local_1c8.pTriggerPrg;
    local_1c8.pTriggerPrg = (local_1c8.pTriggerPrg)->pNext;
LAB_0014d0e0:
    sqlite3DbFreeNN(db,local_1c8.zErrMsg);
  }
LAB_0014d0f5:
  sqlite3ParseObjectReset(&local_1c8);
  return iVar7;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ) sqlite3ErrorMsg(&sParse, "out of memory");
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.disableVtab = (prepFlags & SQLITE_PREPARE_NO_VTAB)!=0;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

  sqlite3VtabUnlockList(db);

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}